

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Threading.cpp
# Opt level: O2

uint llvm::heavyweight_hardware_concurrency(void)

{
  uint uVar1;
  
  uVar1 = sys::getHostNumPhysicalCores();
  if (uVar1 != 0xffffffff) {
    return uVar1;
  }
  uVar1 = std::thread::hardware_concurrency();
  return uVar1;
}

Assistant:

unsigned llvm::heavyweight_hardware_concurrency() {
  // Since we can't get here unless LLVM_ENABLE_THREADS == 1, it is safe to use
  // `std::thread` directly instead of `llvm::thread` (and indeed, doing so
  // allows us to not define `thread` in the llvm namespace, which conflicts
  // with some platforms such as FreeBSD whose headers also define a struct
  // called `thread` in the global namespace which can cause ambiguity due to
  // ADL.
  int NumPhysical = sys::getHostNumPhysicalCores();
  if (NumPhysical == -1)
    return std::thread::hardware_concurrency();
  return NumPhysical;
}